

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sign.cpp
# Opt level: O2

bool SignStep(SigningProvider *provider,BaseSignatureCreator *creator,CScript *scriptPubKey,
             vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             *ret,TxoutType *whichTypeRet,SigVersion sigversion,SignatureData *sigdata)

{
  TaprootSpendData *pubkey_00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this;
  long lVar1;
  uchar *puVar2;
  pointer n;
  TaprootSpendData other;
  undefined8 uVar3;
  bool bVar4;
  TxoutType TVar5;
  int iVar6;
  Availability AVar7;
  iterator iVar8;
  size_t sVar9;
  _Base_ptr p_Var10;
  size_type sVar11;
  pointer pvVar12;
  pointer pvVar13;
  size_t i;
  ulong uVar14;
  size_t sVar15;
  ulong uVar16;
  size_t i_1;
  long lVar17;
  long in_FS_OFFSET;
  Span<const_unsigned_char> vch;
  Span<const_unsigned_char> vch_00;
  Span<const_unsigned_char> vch_01;
  Span<const_unsigned_char> vch_02;
  Span<const_unsigned_char> script;
  undefined4 in_stack_fffffffffffffcb8;
  undefined4 uStack_344;
  undefined4 uStack_330;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  vSolutions;
  undefined8 uStack_300;
  vector<unsigned_char,_std::allocator<unsigned_char>_> sig;
  size_t sStack_2e0;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  result_stack;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  smallest_result_stack;
  Node<XOnlyPubKey> *local_298;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_290;
  base_blob<256U> local_288;
  uchar local_268 [4];
  uchar auStack_264 [4];
  uchar auStack_260 [4];
  uchar auStack_25c [4];
  uchar local_258 [8];
  uchar auStack_250 [8];
  CScript scriptRet;
  uint256 leaf_hash;
  vector<unsigned_char,_std::allocator<unsigned_char>_> sig_1;
  undefined1 local_1a8 [16];
  uchar local_198 [48];
  _Rb_tree<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>,_std::_Select1st<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>,_std::less<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>
  local_168;
  CKeyID keyID;
  undefined4 uStack_124;
  CPubKey pubkey;
  _Rb_tree_node_base local_80;
  size_t local_60;
  KeyOriginInfo info;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  scriptRet.super_CScriptBase._union._16_8_ = 0;
  scriptRet.super_CScriptBase._24_8_ = 0;
  scriptRet.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  scriptRet.super_CScriptBase._union._8_8_ = 0;
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::clear(ret);
  sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vSolutions.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vSolutions.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vSolutions.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  TVar5 = Solver(scriptPubKey,&vSolutions);
  *whichTypeRet = TVar5;
  bVar4 = false;
  switch(TVar5) {
  case NONSTANDARD:
  case NULL_DATA:
  case WITNESS_UNKNOWN:
    break;
  case PUBKEY:
    CPubKey::Set<unsigned_char_const*>
              (&pubkey,((vSolutions.
                         super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                       super__Vector_impl_data._M_start,
               ((vSolutions.
                 super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish);
    bVar4 = CreateSig(creator,sigdata,provider,&sig,&pubkey,scriptPubKey,sigversion);
    if (bVar4) {
      bVar4 = true;
      std::
      vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
      ::emplace_back<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ((vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  *)ret,&sig);
      break;
    }
    goto LAB_00333400;
  case PUBKEYHASH:
    puVar2 = ((vSolutions.
               super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    vch.m_size = (long)((vSolutions.
                         super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                       super__Vector_impl_data._M_finish - (long)puVar2;
    vch.m_data = puVar2;
    base_blob<160U>::base_blob((base_blob<160U> *)&pubkey,vch);
    stack0xfffffffffffffed8 = (pointer)CONCAT44(uStack_124,pubkey.vch._16_4_);
    keyID.super_uint160.super_base_blob<160U>.m_data._M_elems[0] = pubkey.vch[0];
    keyID.super_uint160.super_base_blob<160U>.m_data._M_elems[1] = pubkey.vch[1];
    keyID.super_uint160.super_base_blob<160U>.m_data._M_elems[2] = pubkey.vch[2];
    keyID.super_uint160.super_base_blob<160U>.m_data._M_elems[3] = pubkey.vch[3];
    keyID.super_uint160.super_base_blob<160U>.m_data._M_elems[4] = pubkey.vch[4];
    keyID.super_uint160.super_base_blob<160U>.m_data._M_elems[5] = pubkey.vch[5];
    keyID.super_uint160.super_base_blob<160U>.m_data._M_elems[6] = pubkey.vch[6];
    keyID.super_uint160.super_base_blob<160U>.m_data._M_elems[7] = pubkey.vch[7];
    keyID.super_uint160.super_base_blob<160U>.m_data._M_elems[8] = pubkey.vch[8];
    keyID.super_uint160.super_base_blob<160U>.m_data._M_elems[9] = pubkey.vch[9];
    keyID.super_uint160.super_base_blob<160U>.m_data._M_elems[10] = pubkey.vch[10];
    keyID.super_uint160.super_base_blob<160U>.m_data._M_elems[0xb] = pubkey.vch[0xb];
    keyID.super_uint160.super_base_blob<160U>.m_data._M_elems[0xc] = pubkey.vch[0xc];
    keyID.super_uint160.super_base_blob<160U>.m_data._M_elems[0xd] = pubkey.vch[0xd];
    keyID.super_uint160.super_base_blob<160U>.m_data._M_elems[0xe] = pubkey.vch[0xe];
    keyID.super_uint160.super_base_blob<160U>.m_data._M_elems[0xf] = pubkey.vch[0xf];
    pubkey.vch[0] = 0xff;
    bVar4 = GetPubKey(provider,sigdata,&keyID,&pubkey);
    if (bVar4) {
      bVar4 = CreateSig(creator,sigdata,provider,&sig,&pubkey,scriptPubKey,sigversion);
      if (bVar4) {
        std::
        vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
        ::emplace_back<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ((vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                    *)ret,&sig);
        ToByteVector<CPubKey>
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1a8,&pubkey);
        std::
        vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
        ::emplace_back<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ((vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                    *)ret,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1a8);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_1a8);
        goto switchD_00332d0f_caseD_1;
      }
    }
    else {
      std::vector<CKeyID,_std::allocator<CKeyID>_>::push_back(&sigdata->missing_pubkeys,&keyID);
    }
LAB_00333400:
    bVar4 = false;
    break;
  case SCRIPTHASH:
    puVar2 = ((vSolutions.
               super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    vch_00.m_size =
         (long)((vSolutions.
                 super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish - (long)puVar2;
    vch_00.m_data = puVar2;
    base_blob<160U>::base_blob((base_blob<160U> *)&pubkey,vch_00);
    uVar3 = pubkey.vch._16_8_;
    local_198[0] = pubkey.vch[0x10];
    local_198[1] = pubkey.vch[0x11];
    local_198[2] = pubkey.vch[0x12];
    local_198[3] = pubkey.vch[0x13];
    local_1a8[0] = pubkey.vch[0];
    local_1a8[1] = pubkey.vch[1];
    local_1a8[2] = pubkey.vch[2];
    local_1a8[3] = pubkey.vch[3];
    local_1a8[4] = pubkey.vch[4];
    local_1a8[5] = pubkey.vch[5];
    local_1a8[6] = pubkey.vch[6];
    local_1a8[7] = pubkey.vch[7];
    local_1a8[8] = pubkey.vch[8];
    local_1a8[9] = pubkey.vch[9];
    local_1a8[10] = pubkey.vch[10];
    local_1a8[0xb] = pubkey.vch[0xb];
    local_1a8[0xc] = pubkey.vch[0xc];
    local_1a8[0xd] = pubkey.vch[0xd];
    local_1a8[0xe] = pubkey.vch[0xe];
    local_1a8[0xf] = pubkey.vch[0xf];
    pubkey.vch._16_8_ = uVar3;
    bVar4 = GetCScript(provider,sigdata,(CScriptID *)local_1a8,&scriptRet);
    if (bVar4) {
      local_1a8._0_8_ = &scriptRet;
      if (0x1c < scriptRet.super_CScriptBase._size) {
        local_1a8._0_8_ = scriptRet.super_CScriptBase._union.indirect_contents.indirect;
      }
      sVar11 = scriptRet.super_CScriptBase._size - 0x1d;
      if (0x1c >= scriptRet.super_CScriptBase._size) {
        sVar11 = scriptRet.super_CScriptBase._size;
      }
      keyID.super_uint160.super_base_blob<160U>.m_data._M_elems._0_8_ =
           (long)&(((CScript *)local_1a8._0_8_)->super_CScriptBase)._union + (long)(int)sVar11;
      std::
      vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
      ::
      emplace_back<prevector<28u,unsigned_char,unsigned_int,int>::iterator,prevector<28u,unsigned_char,unsigned_int,int>::iterator>
                ((vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  *)ret,(iterator *)local_1a8,(iterator *)&keyID);
    }
    else {
      *(undefined4 *)((sigdata->missing_redeem_script).super_base_blob<160U>.m_data._M_elems + 0x10)
           = pubkey.vch._16_4_;
      *(undefined8 *)(sigdata->missing_redeem_script).super_base_blob<160U>.m_data._M_elems =
           pubkey.vch._0_8_;
      *(undefined8 *)((sigdata->missing_redeem_script).super_base_blob<160U>.m_data._M_elems + 8) =
           pubkey.vch._8_8_;
    }
    break;
  case MULTISIG:
    uVar16 = (ulong)*((vSolutions.
                       super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                     super__Vector_impl_data._M_start;
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::emplace_back<>(ret);
    lVar17 = 0x20;
    for (uVar14 = 1;
        uVar14 < ((long)vSolutions.
                        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)vSolutions.
                       super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) / 0x18 - 1U; uVar14 = uVar14 + 1)
    {
      CPubKey::Set<unsigned_char_const*>
                (&pubkey,*(uchar **)
                          ((long)vSolutions.
                                 super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + lVar17 + -8),
                 *(uchar **)
                  ((long)&((vSolutions.
                            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                          .super__Vector_impl_data._M_start + lVar17));
      bVar4 = CreateSig(creator,sigdata,provider,&sig,&pubkey,scriptPubKey,sigversion);
      if ((bVar4) &&
         ((ulong)(((long)(ret->
                         super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish -
                  (long)(ret->
                        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start) / 0x18) <= uVar16)) {
        std::
        vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
        ::emplace_back<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ((vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                    *)ret,&sig);
      }
      lVar17 = lVar17 + 0x18;
    }
    pvVar13 = (ret->
              super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pvVar12 = (ret->
              super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    bVar4 = ((long)pvVar12 - (long)pvVar13) / 0x18 == uVar16 + 1;
    lVar17 = 0;
    while ((ulong)(((long)pvVar12 - (long)pvVar13) / 0x18 + lVar17) <= uVar16) {
      std::
      vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::emplace_back<>(ret);
      lVar17 = lVar17 + 1;
      pvVar13 = (ret->
                super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pvVar12 = (ret->
                super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish;
    }
    break;
  case WITNESS_V0_SCRIPTHASH:
    n = ((vSolutions.
          super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start)->
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
        super__Vector_impl_data._M_start;
    RIPEMD160(local_1a8,(size_t)n,
              ((vSolutions.
                super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_finish + -(long)n);
    pubkey.vch[0x10] = local_198[0];
    pubkey.vch[0x11] = local_198[1];
    pubkey.vch[0x12] = local_198[2];
    pubkey.vch[0x13] = local_198[3];
    pubkey.vch[0] = local_1a8[0];
    pubkey.vch[1] = local_1a8[1];
    pubkey.vch[2] = local_1a8[2];
    pubkey.vch[3] = local_1a8[3];
    pubkey.vch[4] = local_1a8[4];
    pubkey.vch[5] = local_1a8[5];
    pubkey.vch[6] = local_1a8[6];
    pubkey.vch[7] = local_1a8[7];
    pubkey.vch[8] = local_1a8[8];
    pubkey.vch[9] = local_1a8[9];
    pubkey.vch[10] = local_1a8[10];
    pubkey.vch[0xb] = local_1a8[0xb];
    pubkey.vch[0xc] = local_1a8[0xc];
    pubkey.vch[0xd] = local_1a8[0xd];
    pubkey.vch[0xe] = local_1a8[0xe];
    pubkey.vch[0xf] = local_1a8[0xf];
    bVar4 = GetCScript(provider,sigdata,(CScriptID *)&pubkey,&scriptRet);
    if (!bVar4) {
      puVar2 = ((vSolutions.
                 super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      vch_02.m_size =
           (long)((vSolutions.
                   super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                 super__Vector_impl_data._M_finish - (long)puVar2;
      vch_02.m_data = puVar2;
      base_blob<256U>::base_blob((base_blob<256U> *)&pubkey,vch_02);
      *(undefined8 *)
       ((sigdata->missing_witness_script).super_base_blob<256U>.m_data._M_elems + 0x10) =
           pubkey.vch._16_8_;
      *(undefined8 *)
       ((sigdata->missing_witness_script).super_base_blob<256U>.m_data._M_elems + 0x18) =
           pubkey.vch._24_8_;
      *(undefined8 *)(sigdata->missing_witness_script).super_base_blob<256U>.m_data._M_elems =
           pubkey.vch._0_8_;
      *(undefined8 *)((sigdata->missing_witness_script).super_base_blob<256U>.m_data._M_elems + 8) =
           pubkey.vch._8_8_;
      goto LAB_00333400;
    }
    pubkey.vch._0_8_ = &scriptRet;
    if (0x1c < scriptRet.super_CScriptBase._size) {
      pubkey.vch._0_8_ = scriptRet.super_CScriptBase._union.indirect_contents.indirect;
    }
    sVar11 = scriptRet.super_CScriptBase._size - 0x1d;
    if (0x1c >= scriptRet.super_CScriptBase._size) {
      sVar11 = scriptRet.super_CScriptBase._size;
    }
    local_1a8._0_8_ =
         (long)&(((CScript *)pubkey.vch._0_8_)->super_CScriptBase)._union + (long)(int)sVar11;
    std::
    vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
    ::
    emplace_back<prevector<28u,unsigned_char,unsigned_int,int>::iterator,prevector<28u,unsigned_char,unsigned_int,int>::iterator>
              ((vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                *)ret,(iterator *)&pubkey,(iterator *)local_1a8);
  case ANCHOR:
switchD_00332d0f_caseD_1:
    bVar4 = true;
    break;
  case WITNESS_V0_KEYHASH:
    bVar4 = true;
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::push_back(ret,vSolutions.
                    super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
    break;
  case WITNESS_V1_TAPROOT:
    puVar2 = ((vSolutions.
               super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    vch_01.m_size =
         (long)((vSolutions.
                 super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish - (long)puVar2;
    vch_01.m_data = puVar2;
    base_blob<256U>::base_blob(&local_288,vch_01);
    local_80._M_left = &local_80;
    local_80._M_color = _S_red;
    local_80._M_parent = (_Base_ptr)0x0;
    local_258[0] = local_288.m_data._M_elems[0x10];
    local_258[1] = local_288.m_data._M_elems[0x11];
    local_258[2] = local_288.m_data._M_elems[0x12];
    local_258[3] = local_288.m_data._M_elems[0x13];
    local_258[4] = local_288.m_data._M_elems[0x14];
    local_258[5] = local_288.m_data._M_elems[0x15];
    local_258[6] = local_288.m_data._M_elems[0x16];
    local_258[7] = local_288.m_data._M_elems[0x17];
    auStack_250[0] = local_288.m_data._M_elems[0x18];
    auStack_250[1] = local_288.m_data._M_elems[0x19];
    auStack_250[2] = local_288.m_data._M_elems[0x1a];
    auStack_250[3] = local_288.m_data._M_elems[0x1b];
    auStack_250[4] = local_288.m_data._M_elems[0x1c];
    auStack_250[5] = local_288.m_data._M_elems[0x1d];
    auStack_250[6] = local_288.m_data._M_elems[0x1e];
    auStack_250[7] = local_288.m_data._M_elems[0x1f];
    pubkey.vch[0] = '\0';
    pubkey.vch[1] = '\0';
    pubkey.vch[2] = '\0';
    pubkey.vch[3] = '\0';
    pubkey.vch[4] = '\0';
    pubkey.vch[5] = '\0';
    pubkey.vch[6] = '\0';
    pubkey.vch[7] = '\0';
    pubkey.vch[8] = '\0';
    pubkey.vch[9] = '\0';
    pubkey.vch[10] = '\0';
    pubkey.vch[0xb] = '\0';
    pubkey.vch[0xc] = '\0';
    pubkey.vch[0xd] = '\0';
    pubkey.vch[0xe] = '\0';
    pubkey.vch[0xf] = '\0';
    pubkey.vch[0x10] = '\0';
    pubkey.vch[0x11] = '\0';
    pubkey.vch[0x12] = '\0';
    pubkey.vch[0x13] = '\0';
    pubkey.vch[0x14] = '\0';
    pubkey.vch[0x15] = '\0';
    pubkey.vch[0x16] = '\0';
    pubkey.vch[0x17] = '\0';
    pubkey.vch[0x18] = '\0';
    pubkey.vch[0x19] = '\0';
    pubkey.vch[0x1a] = '\0';
    pubkey.vch[0x1b] = '\0';
    pubkey.vch[0x1c] = '\0';
    pubkey.vch[0x1d] = '\0';
    pubkey.vch[0x1e] = '\0';
    pubkey.vch[0x1f] = '\0';
    pubkey.vch[0x20] = '\0';
    pubkey.vch[0x21] = '\0';
    pubkey.vch[0x22] = '\0';
    pubkey.vch[0x23] = '\0';
    pubkey.vch[0x24] = '\0';
    pubkey.vch[0x25] = '\0';
    pubkey.vch[0x26] = '\0';
    pubkey.vch[0x27] = '\0';
    pubkey.vch[0x28] = '\0';
    pubkey.vch[0x29] = '\0';
    pubkey.vch[0x2a] = '\0';
    pubkey.vch[0x2b] = '\0';
    pubkey.vch[0x2c] = '\0';
    pubkey.vch[0x2d] = '\0';
    pubkey.vch[0x2e] = '\0';
    pubkey.vch[0x2f] = '\0';
    pubkey.vch[0x30] = '\0';
    pubkey.vch[0x31] = '\0';
    pubkey.vch[0x32] = '\0';
    pubkey.vch[0x33] = '\0';
    pubkey.vch[0x34] = '\0';
    pubkey.vch[0x35] = '\0';
    pubkey.vch[0x36] = '\0';
    pubkey.vch[0x37] = '\0';
    pubkey.vch[0x38] = '\0';
    pubkey.vch[0x39] = '\0';
    pubkey.vch[0x3a] = '\0';
    pubkey.vch[0x3b] = '\0';
    pubkey.vch[0x3c] = '\0';
    pubkey.vch[0x3d] = '\0';
    pubkey.vch[0x3e] = '\0';
    pubkey.vch[0x3f] = '\0';
    local_60 = 0;
    local_268[0] = local_288.m_data._M_elems[0];
    local_268[1] = local_288.m_data._M_elems[1];
    local_268[2] = local_288.m_data._M_elems[2];
    local_268[3] = local_288.m_data._M_elems[3];
    auStack_264[0] = local_288.m_data._M_elems[4];
    auStack_264[1] = local_288.m_data._M_elems[5];
    auStack_264[2] = local_288.m_data._M_elems[6];
    auStack_264[3] = local_288.m_data._M_elems[7];
    auStack_260[0] = local_288.m_data._M_elems[8];
    auStack_260[1] = local_288.m_data._M_elems[9];
    auStack_260[2] = local_288.m_data._M_elems[10];
    auStack_260[3] = local_288.m_data._M_elems[0xb];
    auStack_25c[0] = local_288.m_data._M_elems[0xc];
    auStack_25c[1] = local_288.m_data._M_elems[0xd];
    auStack_25c[2] = local_288.m_data._M_elems[0xe];
    auStack_25c[3] = local_288.m_data._M_elems[0xf];
    keyID.super_uint160.super_base_blob<160U>.m_data._M_elems[0] = '\x01';
    keyID.super_uint160.super_base_blob<160U>.m_data._M_elems[8] = '\0';
    keyID.super_uint160.super_base_blob<160U>.m_data._M_elems[9] = '\0';
    keyID.super_uint160.super_base_blob<160U>.m_data._M_elems[10] = '\0';
    keyID.super_uint160.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
    keyID.super_uint160.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
    keyID.super_uint160.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
    keyID.super_uint160.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
    keyID.super_uint160.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
    stack0xfffffffffffffed8 = (pointer)0x0;
    local_80._M_right = local_80._M_left;
    iVar6 = (*provider->_vptr_SigningProvider[8])(provider,local_268,&pubkey);
    if ((char)iVar6 != '\0') {
      TaprootSpendData::TaprootSpendData((TaprootSpendData *)local_1a8,(TaprootSpendData *)&pubkey);
      other.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems._4_4_ = uStack_344;
      other.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0] =
           (char)in_stack_fffffffffffffcb8;
      other.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[1] =
           (char)((uint)in_stack_fffffffffffffcb8 >> 8);
      other.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[2] =
           (char)((uint)in_stack_fffffffffffffcb8 >> 0x10);
      other.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[3] =
           (char)((uint)in_stack_fffffffffffffcb8 >> 0x18);
      other.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems._8_8_ = provider;
      other.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems._16_8_ = ret;
      other.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems._24_4_ = uStack_330;
      other.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems._28_4_ = sigversion;
      other.merkle_root.super_base_blob<256U>.m_data._M_elems._0_8_ = creator;
      other.merkle_root.super_base_blob<256U>.m_data._M_elems._8_8_ = scriptPubKey;
      other.merkle_root.super_base_blob<256U>.m_data._M_elems._16_8_ =
           vSolutions.
           super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      other.merkle_root.super_base_blob<256U>.m_data._M_elems._24_8_ =
           vSolutions.
           super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      other.scripts._M_t._M_impl._0_8_ =
           vSolutions.
           super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      other.scripts._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = uStack_300;
      other.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)
           sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
      other.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           (_Base_ptr)
           sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
      other.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           (_Base_ptr)
           sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      other.scripts._M_t._M_impl.super__Rb_tree_header._M_node_count = sStack_2e0;
      TaprootSpendData::Merge(&sigdata->tr_spenddata,other);
      std::
      _Rb_tree<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>,_std::_Select1st<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>,_std::less<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>
      ::~_Rb_tree(&local_168);
    }
    iVar6 = (*provider->_vptr_SigningProvider[9])(provider,local_268,&keyID);
    if ((char)iVar6 != '\0') {
      std::optional<TaprootBuilder>::operator=(&sigdata->tr_builder,(TaprootBuilder *)&keyID);
    }
    info.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    info.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    info.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pubkey_00 = &sigdata->tr_spenddata;
    bVar4 = SigningProvider::GetKeyOriginByXOnly(provider,&pubkey_00->internal_key,&info);
    if (bVar4) {
      iVar8 = std::
              _Rb_tree<XOnlyPubKey,_std::pair<const_XOnlyPubKey,_std::pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>_>,_std::_Select1st<std::pair<const_XOnlyPubKey,_std::pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>_>_>,_std::less<XOnlyPubKey>,_std::allocator<std::pair<const_XOnlyPubKey,_std::pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>_>_>_>
              ::find(&(sigdata->taproot_misc_pubkeys)._M_t,&pubkey_00->internal_key);
      if ((_Rb_tree_header *)iVar8._M_node ==
          &(sigdata->taproot_misc_pubkeys)._M_t._M_impl.super__Rb_tree_header) {
        leaf_hash.super_base_blob<256U>.m_data._M_elems._24_8_ =
             leaf_hash.super_base_blob<256U>.m_data._M_elems + 8;
        leaf_hash.super_base_blob<256U>.m_data._M_elems[0] = '\0';
        leaf_hash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
        leaf_hash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
        leaf_hash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
        leaf_hash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
        leaf_hash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
        leaf_hash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
        leaf_hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
        leaf_hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
        leaf_hash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
        leaf_hash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
        leaf_hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
        leaf_hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
        leaf_hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
        leaf_hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
        leaf_hash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
        leaf_hash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
        leaf_hash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
        leaf_hash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
        leaf_hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
        leaf_hash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
        leaf_hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
        leaf_hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
        leaf_hash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
        std::pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>::
        pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo_&,_true>
                  ((pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>
                    *)&sig_1,
                   (set<uint256,_std::less<uint256>,_std::allocator<uint256>_> *)&leaf_hash,&info);
        std::
        _Rb_tree<XOnlyPubKey,std::pair<XOnlyPubKey_const,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>>,std::_Select1st<std::pair<XOnlyPubKey_const,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>>>,std::less<XOnlyPubKey>,std::allocator<std::pair<XOnlyPubKey_const,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>>>>
        ::
        _M_emplace_unique<XOnlyPubKey&,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>>
                  ((_Rb_tree<XOnlyPubKey,std::pair<XOnlyPubKey_const,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>>,std::_Select1st<std::pair<XOnlyPubKey_const,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>>>,std::less<XOnlyPubKey>,std::allocator<std::pair<XOnlyPubKey_const,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>>>>
                    *)&sigdata->taproot_misc_pubkeys,&pubkey_00->internal_key,
                   (pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>
                    *)&sig_1);
        std::pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>::
        ~pair((pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>
               *)&sig_1);
        std::
        _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
        ::~_Rb_tree((_Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
                     *)&leaf_hash);
      }
    }
    sig_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    sig_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    sig_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    this = &sigdata->taproot_key_path_sig;
    if (((sigdata->taproot_key_path_sig).
         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish ==
         (sigdata->taproot_key_path_sig).
         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start) &&
       (iVar6 = (*creator->_vptr_BaseSignatureCreator[4])
                          (creator,provider,&sig_1,pubkey_00,0,&(sigdata->tr_spenddata).merkle_root,
                           2), (char)iVar6 != '\0')) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(this,&sig_1);
    }
    if (((sigdata->taproot_key_path_sig).
         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish ==
         (sigdata->taproot_key_path_sig).
         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start) &&
       (iVar6 = (*creator->_vptr_BaseSignatureCreator[4])(creator,provider,&sig_1,local_268,0,0,2),
       (char)iVar6 != '\0')) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(this,&sig_1);
    }
    if ((sigdata->taproot_key_path_sig).
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        (sigdata->taproot_key_path_sig).
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start) {
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&sig_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                (&info.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
      smallest_result_stack.
      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      smallest_result_stack.
      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      smallest_result_stack.
      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      for (p_Var10 = (sigdata->tr_spenddata).scripts._M_t._M_impl.super__Rb_tree_header._M_header.
                     _M_left;
          (_Rb_tree_header *)p_Var10 !=
          &(sigdata->tr_spenddata).scripts._M_t._M_impl.super__Rb_tree_header;
          p_Var10 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var10)) {
        result_stack.
        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        result_stack.
        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        result_stack.
        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        if (*(int *)&p_Var10[1]._M_right == 0xc0) {
          puVar2 = *(uchar **)(p_Var10 + 1);
          sVar15 = (long)p_Var10[1]._M_parent - (long)puVar2;
          script.m_size = sVar15;
          script.m_data = puVar2;
          ComputeTapleafHash(&leaf_hash,0xc0,script);
          prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector<const_unsigned_char_*>
                    ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&info,puVar2,
                     puVar2 + sVar15);
          sig_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = &sigdata->complete;
          sig_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)provider;
          sig_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)creator;
          miniscript::FromScript<TapSatisfier>
                    ((miniscript *)&local_298,(CScript *)&info,(TapSatisfier *)&sig_1);
          if (local_298 == (Node<XOnlyPubKey> *)0x0) {
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_290);
            prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
                      ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&info);
          }
          else {
            AVar7 = miniscript::Node<XOnlyPubKey>::Satisfy<TapSatisfier>
                              (local_298,(TapSatisfier *)&sig_1,&result_stack,true);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_290);
            prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
                      ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&info);
            if (AVar7 == YES) {
              sig_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start = *(pointer *)(p_Var10 + 1);
              leaf_hash.super_base_blob<256U>.m_data._M_elems._0_8_ = p_Var10[1]._M_parent;
              std::
              vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              ::
              emplace_back<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                        ((vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                          *)&result_stack,
                         (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          *)&sig_1,
                         (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          *)&leaf_hash);
              std::
              vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ::push_back(&result_stack,(value_type *)(p_Var10[2]._M_right + 1));
              if (smallest_result_stack.
                  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish !=
                  smallest_result_stack.
                  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
                sVar15 = GetSerializeSize<std::vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
                                   (&result_stack);
                sVar9 = GetSerializeSize<std::vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
                                  (&smallest_result_stack);
                if (sVar9 <= sVar15) goto LAB_003335ee;
              }
              std::
              vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ::_M_move_assign(&smallest_result_stack,
                               (vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                                *)&result_stack);
            }
          }
        }
LAB_003335ee:
        std::
        vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::~vector(&result_stack);
      }
      bVar4 = smallest_result_stack.
              super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              smallest_result_stack.
              super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
      if (bVar4) {
        std::
        vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::_M_move_assign(ret,&smallest_result_stack);
      }
      std::
      vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::~vector(&smallest_result_stack);
    }
    else {
      Vector<std::vector<unsigned_char,std::allocator<unsigned_char>>&>
                ((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)&leaf_hash,this);
      std::
      vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::_M_move_assign(ret,&leaf_hash);
      std::
      vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::~vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 *)&leaf_hash);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&sig_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                (&info.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
      bVar4 = true;
    }
    std::
    vector<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
    ::~vector((vector<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
               *)(keyID.super_uint160.super_base_blob<160U>.m_data._M_elems + 8));
    std::
    _Rb_tree<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>,_std::_Select1st<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>,_std::less<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>,_std::_Select1st<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>,_std::less<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>
                 *)(pubkey.vch + 0x40));
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/sign.cpp"
                  ,0x1e2,
                  "bool SignStep(const SigningProvider &, const BaseSignatureCreator &, const CScript &, std::vector<valtype> &, TxoutType &, SigVersion, SignatureData &)"
                 );
  }
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::~vector(&vSolutions);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&scriptRet.super_CScriptBase);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return bVar4;
}

Assistant:

static bool SignStep(const SigningProvider& provider, const BaseSignatureCreator& creator, const CScript& scriptPubKey,
                     std::vector<valtype>& ret, TxoutType& whichTypeRet, SigVersion sigversion, SignatureData& sigdata)
{
    CScript scriptRet;
    ret.clear();
    std::vector<unsigned char> sig;

    std::vector<valtype> vSolutions;
    whichTypeRet = Solver(scriptPubKey, vSolutions);

    switch (whichTypeRet) {
    case TxoutType::NONSTANDARD:
    case TxoutType::NULL_DATA:
    case TxoutType::WITNESS_UNKNOWN:
        return false;
    case TxoutType::PUBKEY:
        if (!CreateSig(creator, sigdata, provider, sig, CPubKey(vSolutions[0]), scriptPubKey, sigversion)) return false;
        ret.push_back(std::move(sig));
        return true;
    case TxoutType::PUBKEYHASH: {
        CKeyID keyID = CKeyID(uint160(vSolutions[0]));
        CPubKey pubkey;
        if (!GetPubKey(provider, sigdata, keyID, pubkey)) {
            // Pubkey could not be found, add to missing
            sigdata.missing_pubkeys.push_back(keyID);
            return false;
        }
        if (!CreateSig(creator, sigdata, provider, sig, pubkey, scriptPubKey, sigversion)) return false;
        ret.push_back(std::move(sig));
        ret.push_back(ToByteVector(pubkey));
        return true;
    }
    case TxoutType::SCRIPTHASH: {
        uint160 h160{vSolutions[0]};
        if (GetCScript(provider, sigdata, CScriptID{h160}, scriptRet)) {
            ret.emplace_back(scriptRet.begin(), scriptRet.end());
            return true;
        }
        // Could not find redeemScript, add to missing
        sigdata.missing_redeem_script = h160;
        return false;
    }
    case TxoutType::MULTISIG: {
        size_t required = vSolutions.front()[0];
        ret.emplace_back(); // workaround CHECKMULTISIG bug
        for (size_t i = 1; i < vSolutions.size() - 1; ++i) {
            CPubKey pubkey = CPubKey(vSolutions[i]);
            // We need to always call CreateSig in order to fill sigdata with all
            // possible signatures that we can create. This will allow further PSBT
            // processing to work as it needs all possible signature and pubkey pairs
            if (CreateSig(creator, sigdata, provider, sig, pubkey, scriptPubKey, sigversion)) {
                if (ret.size() < required + 1) {
                    ret.push_back(std::move(sig));
                }
            }
        }
        bool ok = ret.size() == required + 1;
        for (size_t i = 0; i + ret.size() < required + 1; ++i) {
            ret.emplace_back();
        }
        return ok;
    }
    case TxoutType::WITNESS_V0_KEYHASH:
        ret.push_back(vSolutions[0]);
        return true;

    case TxoutType::WITNESS_V0_SCRIPTHASH:
        if (GetCScript(provider, sigdata, CScriptID{RIPEMD160(vSolutions[0])}, scriptRet)) {
            ret.emplace_back(scriptRet.begin(), scriptRet.end());
            return true;
        }
        // Could not find witnessScript, add to missing
        sigdata.missing_witness_script = uint256(vSolutions[0]);
        return false;

    case TxoutType::WITNESS_V1_TAPROOT:
        return SignTaproot(provider, creator, WitnessV1Taproot(XOnlyPubKey{vSolutions[0]}), sigdata, ret);

    case TxoutType::ANCHOR:
        return true;
    } // no default case, so the compiler can warn about missing cases
    assert(false);
}